

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawfunc.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VMStd vm;
  string local_90;
  VM local_70;
  
  squall::VMStd::VMStd((VMStd *)&local_70,0x400);
  squall::VMStd::dofile((VMStd *)&local_70,"rawfunc.nut");
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"foo","");
  squall::TableBase::defraw
            ((TableBase *)
             local_70.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_90,foo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bar","");
  squall::TableBase::call<void>
            ((TableBase *)
             local_70.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  squall::VM::~VM(&local_70);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("rawfunc.nut");

        vm.defraw("foo", foo);
        vm.call<void>("bar");
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}